

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Reprint(lemon *lemp)

{
  uint uVar1;
  rule *prVar2;
  symbol *psVar3;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  rule **pprVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  
  uVar10 = 0;
  printf("// Reprint of input file \"%s\".\n// Symbols:\n",lemp->filename);
  uVar4 = lemp->nsymbol;
  uVar11 = 0;
  if (0 < (int)uVar4) {
    uVar11 = (ulong)uVar4;
  }
  uVar12 = 10;
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    sVar5 = strlen(lemp->symbols[uVar10]->name);
    uVar1 = (uint)sVar5;
    if ((int)(uint)sVar5 < (int)uVar12) {
      uVar1 = uVar12;
    }
    uVar12 = uVar1;
  }
  iVar6 = 1;
  if (uVar12 < 0x48) {
    iVar6 = (int)(0x4c / (ulong)(uVar12 + 5));
  }
  uVar4 = (int)(uVar4 + iVar6 + -1) / iVar6;
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar10 = (ulong)uVar4;
  }
  uVar11 = 0;
  do {
    if (uVar11 == uVar10) {
      pprVar7 = &lemp->rule;
      while (prVar2 = *pprVar7, prVar2 != (rule *)0x0) {
        printf("%s",prVar2->lhs->name);
        printf(" ::=");
        for (lVar9 = 0; lVar9 < prVar2->nrhs; lVar9 = lVar9 + 1) {
          psVar3 = prVar2->rhs[lVar9];
          if (psVar3->type == MULTITERMINAL) {
            printf(" %s",(*psVar3->subsym)->name);
            for (lVar13 = 1; lVar13 < psVar3->nsubsym; lVar13 = lVar13 + 1) {
              printf("|%s",psVar3->subsym[lVar13]->name);
            }
          }
          else {
            printf(" %s",psVar3->name);
          }
        }
        putchar(0x2e);
        if (prVar2->precsym != (symbol *)0x0) {
          printf(" [%s]",prVar2->precsym->name);
        }
        putchar(10);
        pprVar7 = &prVar2->next;
      }
      return;
    }
    printf("//");
    for (uVar8 = uVar11; (long)uVar8 < (long)lemp->nsymbol; uVar8 = uVar8 + (long)(int)uVar4) {
      uVar1 = lemp->symbols[uVar8]->index;
      if ((uint)uVar8 != uVar1) {
        __assert_fail("sp->index==j",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0xbc8,"void Reprint(struct lemon *)");
      }
      printf(" %3d %-*.*s",(ulong)uVar1,(ulong)uVar12,(ulong)uVar12,lemp->symbols[uVar8]->name);
    }
    putchar(10);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void Reprint(struct lemon *lemp)
{
  struct rule *rp;
  struct symbol *sp;
  int i, j, maxlen, len, ncolumns, skip;
  printf("// Reprint of input file \"%s\".\n// Symbols:\n",lemp->filename);
  maxlen = 10;
  for(i=0; i<lemp->nsymbol; i++){
    sp = lemp->symbols[i];
    len = lemonStrlen(sp->name);
    if( len>maxlen ) maxlen = len;
  }
  ncolumns = 76/(maxlen+5);
  if( ncolumns<1 ) ncolumns = 1;
  skip = (lemp->nsymbol + ncolumns - 1)/ncolumns;
  for(i=0; i<skip; i++){
    printf("//");
    for(j=i; j<lemp->nsymbol; j+=skip){
      sp = lemp->symbols[j];
      assert( sp->index==j );
      printf(" %3d %-*.*s",j,maxlen,maxlen,sp->name);
    }
    printf("\n");
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    printf("%s",rp->lhs->name);
    /*    if( rp->lhsalias ) printf("(%s)",rp->lhsalias); */
    printf(" ::=");
    for(i=0; i<rp->nrhs; i++){
      sp = rp->rhs[i];
      if( sp->type==MULTITERMINAL ){
        printf(" %s", sp->subsym[0]->name);
        for(j=1; j<sp->nsubsym; j++){
          printf("|%s", sp->subsym[j]->name);
        }
      }else{
        printf(" %s", sp->name);
      }
      /* if( rp->rhsalias[i] ) printf("(%s)",rp->rhsalias[i]); */
    }
    printf(".");
    if( rp->precsym ) printf(" [%s]",rp->precsym->name);
    /* if( rp->code ) printf("\n    %s",rp->code); */
    printf("\n");
  }
}